

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Selectable(char *label,bool selected,ImGuiSelectableFlags flags,ImVec2 *size_arg)

{
  ImVec2 IVar1;
  bool bVar2;
  float *in_RCX;
  uint in_EDX;
  byte in_SIL;
  float fVar3;
  float fVar4;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  ImGuiButtonFlags button_flags;
  float spacing_D;
  float spacing_R;
  float spacing_U;
  float spacing_L;
  ImRect bb;
  ImVec2 size_draw;
  float w_draw;
  float max_x;
  ImVec2 window_padding;
  ImRect bb_inner;
  ImVec2 pos;
  ImVec2 size;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  char *in_stack_fffffffffffffec0;
  ImVec4 *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  ImGuiID in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  ImRect *bb_00;
  float _y;
  float fVar5;
  float fVar6;
  float fVar7;
  ImVec2 *this;
  undefined4 in_stack_fffffffffffffef8;
  float _y_00;
  float _x;
  float fVar8;
  float rounding;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  ImVec2 in_stack_ffffffffffffff18;
  byte local_c6;
  byte local_c5;
  ImVec2 local_b0;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  undefined1 local_98 [20];
  ImVec2 local_84;
  float local_7c;
  ImVec2 local_78;
  ImVec2 local_70;
  ImRect local_68;
  ImVec2 local_58;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImGuiID local_3c;
  ImGuiStyle *local_38;
  ImGuiContext *local_30;
  ImGuiWindow *local_28;
  float *local_20;
  uint local_18;
  byte local_11;
  bool local_1;
  
  local_11 = in_SIL & 1;
  local_20 = in_RCX;
  local_18 = in_EDX;
  local_28 = GetCurrentWindow();
  if ((local_28->SkipItems & 1U) == 0) {
    local_30 = GImGui;
    local_38 = &GImGui->Style;
    if (((local_18 & 2) != 0) && ((local_28->DC).ColumnsSet != (ImGuiColumnsSet *)0x0)) {
      PopClipRect();
    }
    rounding = 0.0;
    local_3c = ImGuiWindow::GetID((ImGuiWindow *)
                                  CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                  (char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    local_44 = CalcTextSize(in_stack_fffffffffffffed8,
                            (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffec8,0));
    if ((*local_20 != 0.0) || (NAN(*local_20))) {
      _x = *local_20;
    }
    else {
      _x = local_44.x;
    }
    if ((local_20[1] != 0.0) || (NAN(local_20[1]))) {
      _y_00 = local_20[1];
    }
    else {
      _y_00 = local_44.y;
    }
    this = &local_4c;
    fVar8 = _x;
    ImVec2::ImVec2(this,_x,_y_00);
    IVar1 = (local_28->DC).CursorPos;
    local_58.y = IVar1.y;
    local_58.x = IVar1.x;
    local_58.y = local_58.y + (local_28->DC).CurrentLineTextBaseOffset;
    local_70 = operator+(in_stack_fffffffffffffea8,(ImVec2 *)0x164501);
    ImRect::ImRect(&local_68,&local_58,&local_70);
    ItemSize((ImRect *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (float)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    local_78 = local_28->WindowPadding;
    if ((local_18 & 2) == 0) {
      local_98._12_8_ = GetContentRegionMax();
      fVar7 = (float)local_98._12_4_;
    }
    else {
      local_84 = GetWindowContentRegionMax();
      fVar7 = local_84.x;
    }
    local_7c = fVar7;
    local_98._8_4_ =
         ImMax<float>(local_44.x,
                      (((local_28->Pos).x + fVar7) - local_78.x) - (local_28->DC).CursorPos.x);
    fVar5 = (float)local_98._8_4_;
    if (((*local_20 != 0.0) || (NAN(*local_20))) && ((local_18 & 0x2000) == 0)) {
      fVar5 = *local_20;
    }
    if ((local_20[1] != 0.0) || (_y = local_4c.y, NAN(local_20[1]))) {
      _y = local_20[1];
    }
    bb_00 = (ImRect *)local_98;
    fVar6 = fVar5;
    ImVec2::ImVec2((ImVec2 *)bb_00,fVar5,_y);
    local_b0 = operator+(in_stack_fffffffffffffea8,(ImVec2 *)0x1646b0);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff58,&local_58,&local_b0);
    if (((*local_20 == 0.0) && (!NAN(*local_20))) || ((local_18 & 0x2000) != 0)) {
      in_stack_ffffffffffffff60 = local_78.x + in_stack_ffffffffffffff60;
    }
    fVar3 = (float)(int)((local_38->ItemSpacing).x * 0.5);
    fVar4 = (float)(int)((local_38->ItemSpacing).y * 0.5);
    in_stack_ffffffffffffff58 = in_stack_ffffffffffffff58 - fVar3;
    in_stack_ffffffffffffff5c = in_stack_ffffffffffffff5c - fVar4;
    in_stack_ffffffffffffff60 = ((local_38->ItemSpacing).x - fVar3) + in_stack_ffffffffffffff60;
    in_stack_ffffffffffffff64 = ((local_38->ItemSpacing).y - fVar4) + in_stack_ffffffffffffff64;
    bVar2 = ItemAdd(bb_00,in_stack_fffffffffffffed4,(ImRect *)in_stack_fffffffffffffec8);
    if (bVar2) {
      bVar2 = ButtonBehavior((ImRect *)CONCAT44(fVar7,fVar6),(ImGuiID)fVar5,(bool *)bb_00,
                             (bool *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      if ((local_18 & 8) != 0) {
        local_11 = 0;
      }
      if ((((bVar2) || ((local_c5 & 1) != 0)) && ((local_30->NavDisableMouseHover & 1U) == 0)) &&
         ((local_30->NavWindow == local_28 && (local_30->NavLayer == (local_28->DC).NavLayerCurrent)
          ))) {
        local_30->NavDisableHighlight = true;
        SetNavID(local_3c,(local_28->DC).NavLayerCurrent);
      }
      if (bVar2) {
        MarkItemEdited(local_3c);
      }
      if (((local_c5 & 1) != 0) || ((local_11 & 1) != 0)) {
        if (((local_c6 & 1) == 0) || ((local_c5 & 1) == 0)) {
          in_stack_fffffffffffffed4 = 0x18;
          if ((local_c5 & 1) != 0) {
            in_stack_fffffffffffffed4 = 0x19;
          }
        }
        else {
          in_stack_fffffffffffffed4 = 0x1a;
        }
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                    SUB84(in_stack_fffffffffffffec0,0));
        IVar1.y = in_stack_ffffffffffffff64;
        IVar1.x = in_stack_ffffffffffffff60;
        RenderFrame(IVar1,in_stack_ffffffffffffff18,(ImU32)in_stack_ffffffffffffff14,
                    SUB41((uint)in_stack_ffffffffffffff10 >> 0x18,0),rounding);
        RenderNavHighlight((ImRect *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           (ImGuiID)in_stack_ffffffffffffff5c,
                           (ImGuiNavHighlightFlags)in_stack_ffffffffffffff58);
      }
      if (((local_18 & 2) != 0) && ((local_28->DC).ColumnsSet != (ImGuiColumnsSet *)0x0)) {
        PushColumnClipRect((int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
        GetContentRegionMax();
      }
      if ((local_18 & 8) != 0) {
        PushStyleColor(in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
      }
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff10,0.0,0.0);
      RenderTextClipped((ImVec2 *)CONCAT44(fVar8,_x),
                        (ImVec2 *)CONCAT44(_y_00,in_stack_fffffffffffffef8),(char *)this,
                        (char *)CONCAT44(fVar7,fVar6),(ImVec2 *)CONCAT44(fVar5,_y),&bb_00->Min,
                        (ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      if ((local_18 & 8) != 0) {
        PopStyleColor(in_stack_fffffffffffffeb4);
      }
      local_1 = bVar2;
      if ((((bVar2) && ((local_28->Flags & 0x4000000U) != 0)) && ((local_18 & 1) == 0)) &&
         (((local_28->DC).ItemFlags & 0x20U) == 0)) {
        CloseCurrentPopup();
      }
    }
    else {
      if (((local_18 & 2) != 0) && ((local_28->DC).ColumnsSet != (ImGuiColumnsSet *)0x0)) {
        PushColumnClipRect((int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
      }
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::Selectable(const char* label, bool selected, ImGuiSelectableFlags flags, const ImVec2& size_arg)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    if ((flags & ImGuiSelectableFlags_SpanAllColumns) && window->DC.ColumnsSet) // FIXME-OPT: Avoid if vertically clipped.
        PopClipRect();

    ImGuiID id = window->GetID(label);
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImVec2 size(size_arg.x != 0.0f ? size_arg.x : label_size.x, size_arg.y != 0.0f ? size_arg.y : label_size.y);
    ImVec2 pos = window->DC.CursorPos;
    pos.y += window->DC.CurrentLineTextBaseOffset;
    ImRect bb_inner(pos, pos + size);
    ItemSize(bb_inner);

    // Fill horizontal space.
    ImVec2 window_padding = window->WindowPadding;
    float max_x = (flags & ImGuiSelectableFlags_SpanAllColumns) ? GetWindowContentRegionMax().x : GetContentRegionMax().x;
    float w_draw = ImMax(label_size.x, window->Pos.x + max_x - window_padding.x - window->DC.CursorPos.x);
    ImVec2 size_draw((size_arg.x != 0 && !(flags & ImGuiSelectableFlags_DrawFillAvailWidth)) ? size_arg.x : w_draw, size_arg.y != 0.0f ? size_arg.y : size.y);
    ImRect bb(pos, pos + size_draw);
    if (size_arg.x == 0.0f || (flags & ImGuiSelectableFlags_DrawFillAvailWidth))
        bb.Max.x += window_padding.x;

    // Selectables are tightly packed together, we extend the box to cover spacing between selectable.
    float spacing_L = (float)(int)(style.ItemSpacing.x * 0.5f);
    float spacing_U = (float)(int)(style.ItemSpacing.y * 0.5f);
    float spacing_R = style.ItemSpacing.x - spacing_L;
    float spacing_D = style.ItemSpacing.y - spacing_U;
    bb.Min.x -= spacing_L;
    bb.Min.y -= spacing_U;
    bb.Max.x += spacing_R;
    bb.Max.y += spacing_D;
    if (!ItemAdd(bb, id))
    {
        if ((flags & ImGuiSelectableFlags_SpanAllColumns) && window->DC.ColumnsSet)
            PushColumnClipRect();
        return false;
    }

    // We use NoHoldingActiveID on menus so user can click and _hold_ on a menu then drag to browse child entries
    ImGuiButtonFlags button_flags = 0;
    if (flags & ImGuiSelectableFlags_NoHoldingActiveID) button_flags |= ImGuiButtonFlags_NoHoldingActiveID;
    if (flags & ImGuiSelectableFlags_PressedOnClick) button_flags |= ImGuiButtonFlags_PressedOnClick;
    if (flags & ImGuiSelectableFlags_PressedOnRelease) button_flags |= ImGuiButtonFlags_PressedOnRelease;
    if (flags & ImGuiSelectableFlags_Disabled) button_flags |= ImGuiButtonFlags_Disabled;
    if (flags & ImGuiSelectableFlags_AllowDoubleClick) button_flags |= ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnDoubleClick;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (flags & ImGuiSelectableFlags_Disabled)
        selected = false;

    // Hovering selectable with mouse updates NavId accordingly so navigation can be resumed with gamepad/keyboard (this doesn't happen on most widgets)
    if (pressed || hovered)
        if (!g.NavDisableMouseHover && g.NavWindow == window && g.NavLayer == window->DC.NavLayerCurrent)
        {
            g.NavDisableHighlight = true;
            SetNavID(id, window->DC.NavLayerCurrent);
        }
    if (pressed)
        MarkItemEdited(id);

    // Render
    if (hovered || selected)
    {
        const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    }

    if ((flags & ImGuiSelectableFlags_SpanAllColumns) && window->DC.ColumnsSet)
    {
        PushColumnClipRect();
        bb.Max.x -= (GetContentRegionMax().x - max_x);
    }

    if (flags & ImGuiSelectableFlags_Disabled) PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
    RenderTextClipped(bb_inner.Min, bb.Max, label, NULL, &label_size, ImVec2(0.0f,0.0f));
    if (flags & ImGuiSelectableFlags_Disabled) PopStyleColor();

    // Automatically close popups
    if (pressed && (window->Flags & ImGuiWindowFlags_Popup) && !(flags & ImGuiSelectableFlags_DontClosePopups) && !(window->DC.ItemFlags & ImGuiItemFlags_SelectableDontClosePopup))
        CloseCurrentPopup();
    return pressed;
}